

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O0

void __thiscall
TTD::UnorderedArrayList<TTD::NSSnapValues::TopLevelEvalFunctionBodyResolveInfo,_128UL>::
UnorderedArrayList(UnorderedArrayList<TTD::NSSnapValues::TopLevelEvalFunctionBodyResolveInfo,_128UL>
                   *this,SlabAllocator *alloc)

{
  TopLevelEvalFunctionBodyResolveInfo *pTVar1;
  TopLevelEvalFunctionBodyResolveInfo *newBlockData;
  SlabAllocator *alloc_local;
  UnorderedArrayList<TTD::NSSnapValues::TopLevelEvalFunctionBodyResolveInfo,_128UL> *this_local;
  
  this->m_alloc = alloc;
  pTVar1 = SlabAllocatorBase<0>::
           SlabAllocateFixedSizeArray<TTD::NSSnapValues::TopLevelEvalFunctionBodyResolveInfo,128ul>
                     (this->m_alloc);
  (this->m_inlineHeadBlock).BlockData = pTVar1;
  (this->m_inlineHeadBlock).CurrPos = pTVar1;
  (this->m_inlineHeadBlock).EndPos = pTVar1 + 0x80;
  (this->m_inlineHeadBlock).Next = (UnorderedArrayListLink *)0x0;
  return;
}

Assistant:

UnorderedArrayList(SlabAllocator* alloc)
            : m_alloc(alloc)
        {
            T* newBlockData = this->m_alloc->template SlabAllocateFixedSizeArray<T, allocSize>();

            this->m_inlineHeadBlock.BlockData = newBlockData;
            this->m_inlineHeadBlock.CurrPos = newBlockData;
            this->m_inlineHeadBlock.EndPos = newBlockData + allocSize;

            this->m_inlineHeadBlock.Next = nullptr;
        }